

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void MOJOSHADER_runPreshader(MOJOSHADER_preshader *preshader,float *outregs)

{
  double dVar1;
  uint uVar2;
  float *pfVar3;
  double *pdVar4;
  undefined8 uVar5;
  double (*padVar6) [4];
  int cpy;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *__s;
  uint uVar10;
  ulong uVar11;
  MOJOSHADER_preshaderInstruction *pMVar12;
  char *__assertion;
  MOJOSHADER_preshaderOpcode MVar13;
  MOJOSHADER_preshaderOperand *pMVar14;
  double *pdVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  undefined4 uVar19;
  double final;
  undefined4 uVar20;
  double dVar21;
  double dStack_f0;
  ulong local_e8;
  ulong local_e0;
  double dStack_d8;
  double src [3] [4];
  undefined1 *local_70;
  double dStack_68;
  double dst [4];
  
  __s = &local_e8;
  pfVar3 = preshader->registers;
  uVar9 = (ulong)preshader->temp_count;
  uVar8 = 0;
  if (uVar9 == 0) {
    local_70 = (undefined1 *)0x0;
  }
  else {
    lVar16 = -(uVar9 * 8 + 0xf & 0xfffffffffffffff0);
    __s = (ulong *)((long)&local_e8 + lVar16);
    *(undefined8 *)((long)&dStack_f0 + lVar16) = 0x120b4e;
    memset(__s,0,uVar9 << 3);
    local_70 = (undefined1 *)__s;
  }
  dst[1] = 0.0;
  dst[2] = 0.0;
  dStack_68 = 0.0;
  dst[0] = 0.0;
  src[2][1] = 0.0;
  src[2][2] = 0.0;
  src[1][3] = 0.0;
  src[2][0] = 0.0;
  src[1][1] = 0.0;
  src[1][2] = 0.0;
  src[0][3] = 0.0;
  src[1][0] = 0.0;
  src[0][1] = 0.0;
  src[0][2] = 0.0;
  dStack_d8 = 0.0;
  src[0][0] = 0.0;
  pMVar12 = preshader->instructions;
  while( true ) {
    if (preshader->instruction_count <= (uint)uVar8) {
      return;
    }
    uVar2 = pMVar12->element_count;
    lVar16 = (long)(int)uVar2;
    if (lVar16 < 0) break;
    local_e8 = uVar8;
    if (4 < uVar2) {
      __assertion = "elems <= 4";
      *(undefined8 *)((long)__s + -8) = 0x32;
      goto LAB_0012144b;
    }
    MVar13 = pMVar12->opcode;
    pMVar14 = pMVar12->operands;
    local_e0 = (ulong)(uVar2 * 8);
    pdVar15 = &dStack_d8;
    dst[3] = (double)pMVar12;
    src[2][3] = (double)CONCAT44(src[2][3]._4_4_,MVar13);
    for (uVar9 = 0; uVar8 = local_e0, uVar9 < pMVar12->operand_count - 1; uVar9 = uVar9 + 1) {
      bVar17 = MVar13 < MOJOSHADER_PRESHADEROP_MIN_SCALAR;
      bVar18 = uVar9 != 0;
      if (MOJOSHADER_PRESHADEROPERAND_TEMP < pMVar14->type) {
        __assertion = "0 && \"unexpected preshader operand type.\"";
        *(undefined8 *)((long)__s + -8) = 0x77;
        goto LAB_0012144b;
      }
      uVar10 = pMVar14->index;
      uVar11 = (ulong)uVar10;
      switch(pMVar14->type) {
      case MOJOSHADER_PRESHADEROPERAND_INPUT:
        if ((ulong)pMVar14->array_register_count == 0) {
          if (!bVar17 && !bVar18) {
            dStack_d8 = (double)pfVar3[uVar11];
            goto LAB_00120d33;
          }
          for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
            pdVar15[lVar7] = (double)pfVar3[uVar10 + (int)lVar7];
          }
        }
        else {
          uVar10 = uVar10 >> 2;
          for (uVar8 = 0; pMVar14->array_register_count != uVar8; uVar8 = uVar8 + 1) {
            uVar10 = (int)pfVar3[uVar10] + pMVar14->array_registers[uVar8];
          }
          src[uVar9 - 1][3] = (double)(int)pfVar3[uVar10];
        }
        break;
      case MOJOSHADER_PRESHADEROPERAND_OUTPUT:
        if (bVar17 || bVar18) {
          for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
            pdVar15[lVar7] = (double)outregs[uVar10 + (int)lVar7];
          }
        }
        else {
          dStack_d8 = (double)outregs[uVar11];
LAB_00120d33:
        }
        break;
      case MOJOSHADER_PRESHADEROPERAND_LITERAL:
        if (bVar17 || bVar18) {
          if (preshader->literal_count < uVar10 + uVar2) {
            __assertion = "(index + elems) <= preshader->literal_count";
            *(undefined8 *)((long)__s + -8) = 0x40;
            goto LAB_0012144b;
          }
          pdVar4 = preshader->literals;
          *(undefined8 *)((long)__s + -8) = 0x120cfb;
          memcpy(src[uVar9 - 1] + 3,pdVar4 + uVar11,uVar8);
          pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
          MVar13 = src[2][3]._0_4_;
        }
        else {
          for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
            src[-1][lVar7 + 3] = preshader->literals[uVar11];
          }
        }
        break;
      case MOJOSHADER_PRESHADEROPERAND_TEMP:
        if (local_70 != (undefined1 *)0x0) {
          if (!bVar17 && !bVar18) {
            dStack_d8 = *(double *)(local_70 + uVar11 * 8);
            goto LAB_00120d33;
          }
          *(undefined8 *)((long)__s + -8) = 0x120d63;
          memcpy(src[uVar9 - 1] + 3,local_70 + uVar11 * 8,uVar8);
          pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
          MVar13 = src[2][3]._0_4_;
        }
      }
      pMVar14 = pMVar14 + 1;
      pdVar15 = pdVar15 + 4;
    }
    switch(pMVar12->opcode) {
    case MOJOSHADER_PRESHADEROP_MOV:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = src[-1][lVar7 + 3];
      }
      break;
    case MOJOSHADER_PRESHADEROP_NEG:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = -src[-1][lVar7 + 3];
      }
      break;
    case MOJOSHADER_PRESHADEROP_RCP:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = 1.0 / src[-1][lVar7 + 3];
      }
      break;
    case MOJOSHADER_PRESHADEROP_FRC:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        src[2][3] = dVar21;
        *(undefined8 *)((long)__s + -8) = 0x121197;
        dVar21 = floor(dVar21);
        pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        dst[lVar7 + -1] = src[2][3] - dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_EXP:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        *(undefined8 *)((long)__s + -8) = 0x121054;
        dVar21 = exp(dVar21);
        pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_LOG:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        *(undefined8 *)((long)__s + -8) = 0x12110b;
        dVar21 = log(dVar21);
        pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_RSQ:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        if (dVar21 < 0.0) {
          *(undefined8 *)((long)__s + -8) = 0x121243;
          dVar21 = sqrt(dVar21);
          pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        }
        else {
          dVar21 = SQRT(dVar21);
        }
        dst[lVar7 + -1] = 1.0 / dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_SIN:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        *(undefined8 *)((long)__s + -8) = 0x121162;
        dVar21 = sin(dVar21);
        pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_COS:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        *(undefined8 *)((long)__s + -8) = 0x120f3b;
        dVar21 = cos(dVar21);
        pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_ASIN:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        *(undefined8 *)((long)__s + -8) = 0x120e8b;
        dVar21 = asin(dVar21);
        pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_ACOS:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        *(undefined8 *)((long)__s + -8) = 0x120f0b;
        dVar21 = acos(dVar21);
        pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_ATAN:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        *(undefined8 *)((long)__s + -8) = 0x120e1f;
        dVar21 = atan(dVar21);
        pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_MIN:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        uVar19 = SUB84(dVar21,0);
        uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
        dVar1 = src[0][lVar7 + 3];
        if (dVar1 <= dVar21) {
          uVar19 = SUB84(dVar1,0);
          uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        dst[lVar7 + -1] = (double)CONCAT44(uVar20,uVar19);
      }
      break;
    case MOJOSHADER_PRESHADEROP_MAX:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        uVar19 = SUB84(dVar21,0);
        uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
        dVar1 = src[0][lVar7 + 3];
        if (dVar21 <= dVar1) {
          uVar19 = SUB84(dVar1,0);
          uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        dst[lVar7 + -1] = (double)CONCAT44(uVar20,uVar19);
      }
      break;
    case MOJOSHADER_PRESHADEROP_LT:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] =
             (double)((-(ulong)(src[-1][lVar7 + 3] < src[0][lVar7 + 3]) >> 0x20 & 0x3ff00000) <<
                     0x20);
      }
      break;
    case MOJOSHADER_PRESHADEROP_GE:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] =
             (double)((-(ulong)(src[0][lVar7 + 3] <= src[-1][lVar7 + 3]) >> 0x20 & 0x3ff00000) <<
                     0x20);
      }
      break;
    case MOJOSHADER_PRESHADEROP_ADD:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = src[-1][lVar7 + 3] + src[0][lVar7 + 3];
      }
      break;
    case MOJOSHADER_PRESHADEROP_MUL:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = src[-1][lVar7 + 3] * src[0][lVar7 + 3];
      }
      break;
    case MOJOSHADER_PRESHADEROP_ATAN2:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = src[-1][lVar7 + 3];
        dVar1 = src[0][lVar7 + 3];
        *(undefined8 *)((long)__s + -8) = 0x121288;
        dVar21 = atan2(dVar21,dVar1);
        pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_DIV:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = src[-1][lVar7 + 3] / src[0][lVar7 + 3];
      }
      break;
    case MOJOSHADER_PRESHADEROP_CMP:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        padVar6 = src + 1;
        if (0.0 <= src[-1][lVar7 + 3]) {
          padVar6 = src;
        }
        dst[lVar7 + -1] = (*padVar6)[lVar7 + 3];
      }
      break;
    default:
      *(code **)((long)__s + -8) = MOJOSHADER_parseEffect;
      __assert_fail("0 && \"Unhandled preshader opcode!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0xb4,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
    case MOJOSHADER_PRESHADEROP_DOT:
      dVar21 = 0.0;
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = dVar21 + src[-1][lVar7 + 3] * src[0][lVar7 + 3];
      }
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_MIN_SCALAR:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = dStack_d8;
        if (src[0][lVar7 + 3] <= dStack_d8) {
          dVar21 = src[0][lVar7 + 3];
        }
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_MAX_SCALAR:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar21 = dStack_d8;
        if (dStack_d8 <= src[0][lVar7 + 3]) {
          dVar21 = src[0][lVar7 + 3];
        }
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_LT_SCALAR:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = (double)(-(ulong)(dStack_d8 < src[0][lVar7 + 3]) & 0x3ff0000000000000);
      }
      break;
    case MOJOSHADER_PRESHADEROP_GE_SCALAR:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = (double)(-(ulong)(src[0][lVar7 + 3] <= dStack_d8) & 0x3ff0000000000000);
      }
      break;
    case MOJOSHADER_PRESHADEROP_ADD_SCALAR:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = src[0][lVar7 + 3] + dStack_d8;
      }
      break;
    case MOJOSHADER_PRESHADEROP_MUL_SCALAR:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = src[0][lVar7 + 3] * dStack_d8;
      }
      break;
    case MOJOSHADER_PRESHADEROP_ATAN2_SCALAR:
      for (lVar7 = 0; dVar21 = dStack_d8, lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dVar1 = src[0][lVar7 + 3];
        *(undefined8 *)((long)__s + -8) = 0x1211d8;
        dVar21 = atan2(dVar21,dVar1);
        pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
        dst[lVar7 + -1] = dVar21;
      }
      break;
    case MOJOSHADER_PRESHADEROP_DIV_SCALAR:
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        dst[lVar7 + -1] = dStack_d8 / src[0][lVar7 + 3];
      }
    }
    uVar9 = local_e0;
    if (pMVar14->type == MOJOSHADER_PRESHADEROPERAND_TEMP) {
      uVar2 = pMVar14->index;
      if ((ulong)preshader->temp_count < (local_e0 >> 3 & 0x1fffffff) + (ulong)uVar2) {
        *(undefined8 *)((long)__s + -8) = 0x12148f;
        __assert_fail("preshader->temp_count >= operand->index + (elemsbytes / sizeof (double))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0xbc,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      }
      *(undefined8 *)((long)__s + -8) = 0x1213bc;
      memcpy(local_70 + (ulong)uVar2 * 8,&dStack_68,uVar9);
      pMVar12 = (MOJOSHADER_preshaderInstruction *)dst[3];
    }
    else {
      if (pMVar14->type != MOJOSHADER_PRESHADEROPERAND_OUTPUT) {
        *(undefined8 *)((long)__s + -8) = 0x121470;
        __assert_fail("operand->type == MOJOSHADER_PRESHADEROPERAND_OUTPUT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0xc1,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      }
      for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
        outregs[pMVar14->index + (int)lVar7] = (float)dst[lVar7 + -1];
      }
    }
    uVar8 = (ulong)((int)local_e8 + 1);
    pMVar12 = pMVar12 + 1;
  }
  __assertion = "elems >= 0";
  *(undefined8 *)((long)__s + -8) = 0x31;
LAB_0012144b:
  uVar5 = *(undefined8 *)((long)__s + -8);
  *(undefined8 *)((long)__s + -8) = 0x121451;
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                ,(uint)uVar5,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
}

Assistant:

void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *preshader,
                             float *outregs)
{
    const float *inregs = preshader->registers;

    // this is fairly straightforward, as there aren't any branching
    //  opcodes in the preshader instruction set (at the moment, at least).
    const int scalarstart = (int) MOJOSHADER_PRESHADEROP_SCALAR_OPS;

    double *temps = NULL;
    if (preshader->temp_count > 0)
    {
        temps = (double *) alloca(sizeof (double) * preshader->temp_count);
        memset(temps, '\0', sizeof (double) * preshader->temp_count);
    } // if

    double dst[4] = { 0, 0, 0, 0 };
    double src[3][4] = { { 0, 0, 0, 0 }, { 0, 0, 0, 0 }, { 0, 0, 0, 0 } };
    const double *src0 = &src[0][0];
    const double *src1 = &src[1][0];
    const double *src2 = &src[2][0];

    MOJOSHADER_preshaderInstruction *inst = preshader->instructions;
    int instit;

    for (instit = 0; instit < preshader->instruction_count; instit++, inst++)
    {
        const MOJOSHADER_preshaderOperand *operand = inst->operands;
        const int elems = inst->element_count;
        const int elemsbytes = sizeof (double) * elems;
        const int isscalarop = (inst->opcode >= scalarstart);

        assert(elems >= 0);
        assert(elems <= 4);

        // load up our operands...
        int opiter, elemiter;
        for (opiter = 0; opiter < inst->operand_count-1; opiter++, operand++)
        {
            const int isscalar = ((isscalarop) && (opiter == 0));
            const unsigned int index = operand->index;
            switch (operand->type)
            {
                case MOJOSHADER_PRESHADEROPERAND_LITERAL:
                {
                    if (!isscalar)
                    {
                        assert((index + elems) <= preshader->literal_count);
                        memcpy(&src[opiter][0], &preshader->literals[index], elemsbytes);
                    } // if
                    else
                    {
                        for (elemiter = 0; elemiter < elems; elemiter++)
                            src[opiter][elemiter] = preshader->literals[index];
                    } // else
                    break;
                } // case

                case MOJOSHADER_PRESHADEROPERAND_INPUT:
                    if (operand->array_register_count > 0)
                    {
                        int i;
                        const int *regsi = (const int *) inregs;
                        int arrIndex = regsi[((index >> 4) * 4) + ((index >> 2) & 3)];
                        for (i = 0; i < operand->array_register_count; i++)
                        {
                            arrIndex = regsi[operand->array_registers[i] + arrIndex];
                        }
                        src[opiter][0] = arrIndex;
                    } // if
                    else if (isscalar)
                        src[opiter][0] = inregs[index];
                    else
                    {
                        int cpy;
                        for (cpy = 0; cpy < elems; cpy++)
                            src[opiter][cpy] = inregs[index+cpy];
                    } // else
                    break;

                case MOJOSHADER_PRESHADEROPERAND_OUTPUT:
                    if (isscalar)
                        src[opiter][0] = outregs[index];
                    else
                    {
                        int cpy;
                        for (cpy = 0; cpy < elems; cpy++)
                            src[opiter][cpy] = outregs[index+cpy];
                    } // else
                    break;

                case MOJOSHADER_PRESHADEROPERAND_TEMP:
                    if (temps != NULL)
                    {
                        if (isscalar)
                            src[opiter][0] = temps[index];
                        else
                            memcpy(src[opiter], temps + index, elemsbytes);
                    } // if
                    break;

                default:
                    assert(0 && "unexpected preshader operand type.");
                    return;
            } // switch
        } // for

        // run the actual instruction, store result to dst.
        int i;
        switch (inst->opcode)
        {
            #define OPCODE_CASE(op, val) \
                case MOJOSHADER_PRESHADEROP_##op: \
                    for (i = 0; i < elems; i++) { dst[i] = val; } \
                    break;

            //OPCODE_CASE(NOP, 0.0)  // not a real instruction.
            OPCODE_CASE(MOV, src0[i])
            OPCODE_CASE(NEG, -src0[i])
            OPCODE_CASE(RCP, 1.0 / src0[i])
            OPCODE_CASE(FRC, src0[i] - floor(src0[i]))
            OPCODE_CASE(EXP, exp(src0[i]))
            OPCODE_CASE(LOG, log(src0[i]))
            OPCODE_CASE(RSQ, 1.0 / sqrt(src0[i]))
            OPCODE_CASE(SIN, sin(src0[i]))
            OPCODE_CASE(COS, cos(src0[i]))
            OPCODE_CASE(ASIN, asin(src0[i]))
            OPCODE_CASE(ACOS, acos(src0[i]))
            OPCODE_CASE(ATAN, atan(src0[i]))
            OPCODE_CASE(MIN, (src0[i] < src1[i]) ? src0[i] : src1[i])
            OPCODE_CASE(MAX, (src0[i] > src1[i]) ? src0[i] : src1[i])
            OPCODE_CASE(LT, (src0[i] < src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(GE, (src0[i] >= src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(ADD, src0[i] + src1[i])
            OPCODE_CASE(MUL,  src0[i] * src1[i])
            OPCODE_CASE(ATAN2, atan2(src0[i], src1[i]))
            OPCODE_CASE(DIV, src0[i] / src1[i])
            OPCODE_CASE(CMP, (src0[i] >= 0.0) ? src1[i] : src2[i])
            //OPCODE_CASE(NOISE, ???)  // !!! FIXME: don't know what this does
            //OPCODE_CASE(MOVC, ???)  // !!! FIXME: don't know what this does
            OPCODE_CASE(MIN_SCALAR, (src0[0] < src1[i]) ? src0[0] : src1[i])
            OPCODE_CASE(MAX_SCALAR, (src0[0] > src1[i]) ? src0[0] : src1[i])
            OPCODE_CASE(LT_SCALAR, (src0[0] < src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(GE_SCALAR, (src0[0] >= src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(ADD_SCALAR, src0[0] + src1[i])
            OPCODE_CASE(MUL_SCALAR, src0[0] * src1[i])
            OPCODE_CASE(ATAN2_SCALAR, atan2(src0[0], src1[i]))
            OPCODE_CASE(DIV_SCALAR, src0[0] / src1[i])
            //OPCODE_CASE(DOT_SCALAR)  // !!! FIXME: isn't this just a MUL?
            //OPCODE_CASE(NOISE_SCALAR, ???)  // !!! FIXME: ?
            #undef OPCODE_CASE

            case MOJOSHADER_PRESHADEROP_DOT:
            {
                double final = 0.0;
                for (i = 0; i < elems; i++)
                    final += src0[i] * src1[i];
                for (i = 0; i < elems; i++)
                    dst[i] = final;  // !!! FIXME: is this right?
                break;
            } // case

            default:
                assert(0 && "Unhandled preshader opcode!");
                break;
        } // switch

        // Figure out where dst wants to be stored.
        if (operand->type == MOJOSHADER_PRESHADEROPERAND_TEMP)
        {
            assert(preshader->temp_count >=
                    operand->index + (elemsbytes / sizeof (double)));
            memcpy(temps + operand->index, dst, elemsbytes);
        } // if
        else
        {
            assert(operand->type == MOJOSHADER_PRESHADEROPERAND_OUTPUT);
            for (i = 0; i < elems; i++)
                outregs[operand->index + i] = (float) dst[i];
        } // else
    } // for
}